

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_shl__Test::TestBody(correctness_shl__Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  big_integer a;
  undefined1 in_stack_fffffffffffffe3f;
  undefined4 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe44;
  undefined1 in_stack_fffffffffffffe45;
  undefined1 in_stack_fffffffffffffe46;
  int a_00;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  big_integer *in_stack_fffffffffffffe60;
  Type in_stack_fffffffffffffe6c;
  AssertHelper *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  AssertionResult *in_stack_fffffffffffffeb8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  string local_138 [180];
  int in_stack_ffffffffffffff7c;
  big_integer *in_stack_ffffffffffffff80;
  AssertionResult local_50;
  undefined1 local_40 [64];
  
  a_00 = (int)((ulong)local_40 >> 0x20);
  big_integer::big_integer
            ((big_integer *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),a_00);
  big_integer::big_integer
            (in_stack_fffffffffffffe60,
             (big_integer *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  ::operator<<((big_integer *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54);
  big_integer::big_integer
            ((big_integer *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),a_00);
  uVar1 = operator==((big_integer *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (big_integer *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe46,
                                     CONCAT15(in_stack_fffffffffffffe45,
                                              CONCAT14(in_stack_fffffffffffffe44,
                                                       in_stack_fffffffffffffe40)))),
             (bool)in_stack_fffffffffffffe3f);
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe46,
                                     CONCAT15(in_stack_fffffffffffffe45,
                                              CONCAT14(in_stack_fffffffffffffe44,
                                                       in_stack_fffffffffffffe40)))));
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe46,
                                     CONCAT15(in_stack_fffffffffffffe45,
                                              CONCAT14(in_stack_fffffffffffffe44,
                                                       in_stack_fffffffffffffe40)))));
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe46,
                                     CONCAT15(in_stack_fffffffffffffe45,
                                              CONCAT14(in_stack_fffffffffffffe44,
                                                       in_stack_fffffffffffffe40)))));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               in_stack_fffffffffffffea0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,&in_stack_fffffffffffffe60->sign,
               in_stack_fffffffffffffe5c,
               (char *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffec0.ptr_,(Message *)in_stack_fffffffffffffeb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffe45,
                                                      CONCAT14(in_stack_fffffffffffffe44,
                                                               in_stack_fffffffffffffe40)))));
    std::__cxx11::string::~string(local_138);
    testing::Message::~Message((Message *)0x11d711);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11d78c);
  big_integer::operator<<=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  big_integer::big_integer
            ((big_integer *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),a_00);
  uVar3 = operator==((big_integer *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (big_integer *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffffe44,
                                                                   in_stack_fffffffffffffe40)))),
             (bool)in_stack_fffffffffffffe3f);
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffffe44,
                                                                   in_stack_fffffffffffffe40)))));
  uVar4 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffeb8);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               in_stack_fffffffffffffea0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,&in_stack_fffffffffffffe60->sign,
               in_stack_fffffffffffffe5c,
               (char *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffec0.ptr_,(Message *)in_stack_fffffffffffffeb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,in_stack_fffffffffffffe40
                                                                    )))));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
    testing::Message::~Message((Message *)0x11d8ea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11d959);
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,in_stack_fffffffffffffe40))
                                    )));
  return;
}

Assistant:

TEST(correctness, shl_)
{
    big_integer a = 23;

    EXPECT_TRUE((a << 5) == 23 * 32);

    a <<= 5;
    EXPECT_TRUE(a == 23 * 32);
}